

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int generateOutputSubroutine
              (Parse *pParse,Select *p,SelectDest *pIn,SelectDest *pDest,int regReturn,int regPrev,
              KeyInfo *pKeyInfo,int iBreak)

{
  u8 uVar1;
  int iVar2;
  Vdbe *p_00;
  char *zP4;
  int *piVar3;
  byte bVar4;
  uint p2;
  int iVar5;
  int iVar6;
  Op *pOVar7;
  int iVar8;
  
  p_00 = pParse->pVdbe;
  iVar2 = p_00->nOp;
  p2 = sqlite3VdbeMakeLabel((Vdbe *)p_00->pParse);
  if (regPrev != 0) {
    iVar5 = sqlite3VdbeAddOp3(p_00,0x16,regPrev,0,0);
    iVar6 = pIn->iSdst;
    iVar8 = pIn->nSdst;
    if (pKeyInfo != (KeyInfo *)0x0) {
      pKeyInfo->nRef = pKeyInfo->nRef + 1;
    }
    iVar6 = sqlite3VdbeAddOp3(p_00,0x5e,iVar6,regPrev + 1,iVar8);
    sqlite3VdbeChangeP4(p_00,iVar6,(char *)pKeyInfo,-9);
    sqlite3VdbeAddOp3(p_00,0x12,iVar6 + 2,p2,iVar6 + 2);
    if (p_00->db->mallocFailed == '\0') {
      iVar6 = p_00->nOp + -1;
      if (-1 < iVar5) {
        iVar6 = iVar5;
      }
      pOVar7 = p_00->aOp + iVar6;
    }
    else {
      pOVar7 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar7->p2 = p_00->nOp;
    sqlite3VdbeAddOp3(p_00,0x40,pIn->iSdst,regPrev + 1,pIn->nSdst + -1);
    sqlite3VdbeAddOp3(p_00,0x38,1,regPrev,0);
  }
  if (pParse->db->mallocFailed != '\0') {
    return 0;
  }
  if (0 < p->iOffset) {
    sqlite3VdbeAddOp3(p_00,0x2e,p->iOffset,p2,1);
  }
  switch(pDest->eDest) {
  case '\n':
    iVar6 = pIn->iSdst;
    sqlite3VdbeAddOp3(pParse->pVdbe,0x3f,iVar6,pDest->iSDParm,1);
    iVar8 = 1;
    break;
  case '\v':
    if (pParse->nTempReg == '\0') {
      iVar6 = pParse->nMem + 1;
      pParse->nMem = iVar6;
    }
    else {
      bVar4 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar4;
      iVar6 = pParse->aTempReg[bVar4];
    }
    iVar8 = pIn->nSdst;
    zP4 = pDest->zAffSdst;
    iVar5 = sqlite3VdbeAddOp3(p_00,99,pIn->iSdst,iVar8,iVar6);
    sqlite3VdbeChangeP4(p_00,iVar5,zP4,iVar8);
    sqlite3ExprCacheRemove(pParse,pIn->iSdst,pIn->nSdst);
    iVar8 = pIn->nSdst;
    iVar5 = sqlite3VdbeAddOp3(p_00,0x7e,pDest->iSDParm,iVar6,pIn->iSdst);
    if (p_00->db->mallocFailed == '\0') {
      pOVar7 = p_00->aOp;
      pOVar7[iVar5].p4type = -3;
      pOVar7[iVar5].p4.i = iVar8;
    }
    goto LAB_0016c200;
  case '\f':
    uVar1 = pParse->nTempReg;
    if (uVar1 == '\0') {
      iVar6 = pParse->nMem + 1;
      pParse->nMem = iVar6;
LAB_0016c180:
      iVar8 = pParse->nMem + 1;
      pParse->nMem = iVar8;
    }
    else {
      bVar4 = uVar1 - 1;
      pParse->nTempReg = bVar4;
      iVar6 = pParse->aTempReg[bVar4];
      if (bVar4 == 0) goto LAB_0016c180;
      pParse->nTempReg = uVar1 - 2;
      iVar8 = pParse->aTempReg[(byte)(uVar1 - 2)];
    }
    sqlite3VdbeAddOp3(p_00,99,pIn->iSdst,pIn->nSdst,iVar6);
    sqlite3VdbeAddOp3(p_00,0x73,pDest->iSDParm,iVar8,0);
    sqlite3VdbeAddOp3(p_00,0x74,pDest->iSDParm,iVar6,iVar8);
    if (0 < (long)p_00->nOp) {
      p_00->aOp[(long)p_00->nOp + -1].p5 = 8;
    }
    sqlite3ReleaseTempReg(pParse,iVar8);
LAB_0016c200:
    sqlite3ReleaseTempReg(pParse,iVar6);
    goto LAB_0016c20a;
  case '\r':
    iVar6 = pDest->iSdst;
    iVar8 = pIn->nSdst;
    if (iVar6 == 0) {
      iVar6 = sqlite3GetTempRange(pParse,iVar8);
      pDest->iSdst = iVar6;
      iVar8 = pIn->nSdst;
      pDest->nSdst = iVar8;
    }
    iVar5 = pIn->iSdst;
    sqlite3VdbeAddOp3(pParse->pVdbe,0x3f,iVar5,iVar6,iVar8);
    sqlite3ExprCacheRemove(pParse,iVar5,iVar8);
    sqlite3VdbeAddOp3(p_00,0x10,pDest->iSDParm,0,0);
    goto LAB_0016c20a;
  default:
    sqlite3VdbeAddOp3(p_00,0x43,pIn->iSdst,pIn->nSdst,0);
    iVar6 = pIn->iSdst;
    iVar8 = pIn->nSdst;
  }
  sqlite3ExprCacheRemove(pParse,iVar6,iVar8);
LAB_0016c20a:
  if (p->iLimit != 0) {
    sqlite3VdbeAddOp3(p_00,0x30,p->iLimit,iBreak,0);
  }
  piVar3 = p_00->pParse->aLabel;
  if (piVar3 != (int *)0x0) {
    piVar3[(int)~p2] = p_00->nOp;
  }
  sqlite3VdbeAddOp3(p_00,0x34,regReturn,0,0);
  return iVar2;
}

Assistant:

static int generateOutputSubroutine(
  Parse *pParse,          /* Parsing context */
  Select *p,              /* The SELECT statement */
  SelectDest *pIn,        /* Coroutine supplying data */
  SelectDest *pDest,      /* Where to send the data */
  int regReturn,          /* The return address register */
  int regPrev,            /* Previous result register.  No uniqueness if 0 */
  KeyInfo *pKeyInfo,      /* For comparing with previous entry */
  int iBreak              /* Jump here if we hit the LIMIT */
){
  Vdbe *v = pParse->pVdbe;
  int iContinue;
  int addr;

  addr = sqlite3VdbeCurrentAddr(v);
  iContinue = sqlite3VdbeMakeLabel(v);

  /* Suppress duplicates for UNION, EXCEPT, and INTERSECT 
  */
  if( regPrev ){
    int addr1, addr2;
    addr1 = sqlite3VdbeAddOp1(v, OP_IfNot, regPrev); VdbeCoverage(v);
    addr2 = sqlite3VdbeAddOp4(v, OP_Compare, pIn->iSdst, regPrev+1, pIn->nSdst,
                              (char*)sqlite3KeyInfoRef(pKeyInfo), P4_KEYINFO);
    sqlite3VdbeAddOp3(v, OP_Jump, addr2+2, iContinue, addr2+2); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr1);
    sqlite3VdbeAddOp3(v, OP_Copy, pIn->iSdst, regPrev+1, pIn->nSdst-1);
    sqlite3VdbeAddOp2(v, OP_Integer, 1, regPrev);
  }
  if( pParse->db->mallocFailed ) return 0;

  /* Suppress the first OFFSET entries if there is an OFFSET clause
  */
  codeOffset(v, p->iOffset, iContinue);

  assert( pDest->eDest!=SRT_Exists );
  assert( pDest->eDest!=SRT_Table );
  switch( pDest->eDest ){
    /* Store the result as data using a unique key.
    */
    case SRT_EphemTab: {
      int r1 = sqlite3GetTempReg(pParse);
      int r2 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, pIn->iSdst, pIn->nSdst, r1);
      sqlite3VdbeAddOp2(v, OP_NewRowid, pDest->iSDParm, r2);
      sqlite3VdbeAddOp3(v, OP_Insert, pDest->iSDParm, r1, r2);
      sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
      sqlite3ReleaseTempReg(pParse, r2);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

#ifndef SQLITE_OMIT_SUBQUERY
    /* If we are creating a set for an "expr IN (SELECT ...)".
    */
    case SRT_Set: {
      int r1;
      testcase( pIn->nSdst>1 );
      r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp4(v, OP_MakeRecord, pIn->iSdst, pIn->nSdst, 
          r1, pDest->zAffSdst, pIn->nSdst);
      sqlite3ExprCacheAffinityChange(pParse, pIn->iSdst, pIn->nSdst);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, pDest->iSDParm, r1,
                           pIn->iSdst, pIn->nSdst);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

    /* If this is a scalar select that is part of an expression, then
    ** store the results in the appropriate memory cell and break out
    ** of the scan loop.
    */
    case SRT_Mem: {
      assert( pIn->nSdst==1 || pParse->nErr>0 );  testcase( pIn->nSdst!=1 );
      sqlite3ExprCodeMove(pParse, pIn->iSdst, pDest->iSDParm, 1);
      /* The LIMIT clause will jump out of the loop for us */
      break;
    }
#endif /* #ifndef SQLITE_OMIT_SUBQUERY */

    /* The results are stored in a sequence of registers
    ** starting at pDest->iSdst.  Then the co-routine yields.
    */
    case SRT_Coroutine: {
      if( pDest->iSdst==0 ){
        pDest->iSdst = sqlite3GetTempRange(pParse, pIn->nSdst);
        pDest->nSdst = pIn->nSdst;
      }
      sqlite3ExprCodeMove(pParse, pIn->iSdst, pDest->iSdst, pIn->nSdst);
      sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      break;
    }

    /* If none of the above, then the result destination must be
    ** SRT_Output.  This routine is never called with any other
    ** destination other than the ones handled above or SRT_Output.
    **
    ** For SRT_Output, results are stored in a sequence of registers.  
    ** Then the OP_ResultRow opcode is used to cause sqlite3_step() to
    ** return the next row of result.
    */
    default: {
      assert( pDest->eDest==SRT_Output );
      sqlite3VdbeAddOp2(v, OP_ResultRow, pIn->iSdst, pIn->nSdst);
      sqlite3ExprCacheAffinityChange(pParse, pIn->iSdst, pIn->nSdst);
      break;
    }
  }

  /* Jump to the end of the loop if the LIMIT is reached.
  */
  if( p->iLimit ){
    sqlite3VdbeAddOp2(v, OP_DecrJumpZero, p->iLimit, iBreak); VdbeCoverage(v);
  }

  /* Generate the subroutine return
  */
  sqlite3VdbeResolveLabel(v, iContinue);
  sqlite3VdbeAddOp1(v, OP_Return, regReturn);

  return addr;
}